

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::PrintValue<QString,void>(QString *container,ostream *os)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char16_t *obj_bytes;
  char local_3d [5];
  long local_38;
  
  local_3d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 2,1);
  lVar1 = (container->d).size;
  if (lVar1 != 0) {
    obj_bytes = (container->d).ptr;
    lVar2 = lVar1 * 2;
    lVar3 = 0x20;
    local_38 = lVar1;
    do {
      if (lVar3 != 0x20) {
        local_3d[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_3d,1);
        if (lVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_0010f2ed;
        }
      }
      local_3d[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 1,1);
      PrintBytesInObjectTo((uchar *)obj_bytes,2,os);
      obj_bytes = obj_bytes + 1;
      lVar3 = lVar3 + -1;
      lVar2 = lVar2 + -2;
    } while (lVar2 != 0);
    if (local_38 != 0) {
LAB_0010f2ed:
      local_3d[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 3,1);
    }
  }
  local_3d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }